

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

int __thiscall Fl_Table::move_cursor(Fl_Table *this,int R,int C,int shiftselect)

{
  int iVar1;
  int local_20;
  int shiftselect_local;
  int C_local;
  int R_local;
  Fl_Table *this_local;
  
  shiftselect_local = R;
  if (this->select_row == -1) {
    shiftselect_local = R + 1;
  }
  local_20 = C;
  if (this->select_col == -1) {
    local_20 = C + 1;
  }
  shiftselect_local = this->select_row + shiftselect_local;
  local_20 = this->select_col + local_20;
  if (shiftselect_local < 0) {
    shiftselect_local = 0;
  }
  iVar1 = rows(this);
  if (iVar1 <= shiftselect_local) {
    iVar1 = rows(this);
    shiftselect_local = iVar1 + -1;
  }
  if (local_20 < 0) {
    local_20 = 0;
  }
  iVar1 = cols(this);
  if (iVar1 <= local_20) {
    local_20 = cols(this);
    local_20 = local_20 + -1;
  }
  if ((shiftselect_local == this->select_row) && (local_20 == this->select_col)) {
    return 0;
  }
  damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,
              shiftselect_local,local_20);
  this->select_row = shiftselect_local;
  this->select_col = local_20;
  if ((shiftselect == 0) || (iVar1 = Fl::event_state(0x10000), iVar1 == 0)) {
    this->current_row = shiftselect_local;
    this->current_col = local_20;
  }
  if ((shiftselect_local < this->toprow + 1) || (this->botrow + -1 < shiftselect_local)) {
    row_position(this,shiftselect_local);
  }
  if ((local_20 < this->leftcol + 1) || (this->rightcol + -1 < local_20)) {
    col_position(this,local_20);
  }
  return 1;
}

Assistant:

int Fl_Table::move_cursor(int R, int C, int shiftselect) {
  if (select_row == -1) R++;
  if (select_col == -1) C++;
  R += select_row;
  C += select_col;
  if (R < 0) R = 0;
  if (R >= rows()) R = rows() - 1;
  if (C < 0) C = 0;
  if (C >= cols()) C = cols() - 1;
  if (R == select_row && C == select_col) return 0;
  damage_zone(current_row, current_col, select_row, select_col, R, C);
  select_row = R;
  select_col = C;
  if (!shiftselect || !Fl::event_state(FL_SHIFT)) {
    current_row = R;
    current_col = C;
  }
  if (R < toprow + 1 || R > botrow - 1) row_position(R);
  if (C < leftcol + 1 || C > rightcol - 1) col_position(C);
  return 1;
}